

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool vad_simple(vector<float,_std::allocator<float>_> *pcmf32,int sample_rate,int last_ms,
               float vad_thold,float freq_thold,bool verbose)

{
  bool bVar1;
  int iVar2;
  pointer pfVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  
  pfVar3 = (pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)pfVar3) >> 2;
  iVar2 = (last_ms * sample_rate) / 1000;
  iVar6 = (int)uVar7;
  if (iVar6 - iVar2 == 0 || iVar6 < iVar2) {
    bVar1 = false;
  }
  else {
    if (0.0 < freq_thold) {
      high_pass_filter(pcmf32,freq_thold,(float)sample_rate);
      pfVar3 = (pcmf32->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    fVar8 = 0.0;
    uVar4 = 0;
    uVar5 = 0;
    if (0 < iVar6) {
      uVar5 = uVar7 & 0xffffffff;
    }
    fVar9 = 0.0;
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if ((long)(iVar6 - iVar2) <= (long)uVar4) {
        fVar9 = fVar9 + ABS(pfVar3[uVar4]);
      }
      fVar8 = fVar8 + ABS(pfVar3[uVar4]);
    }
    if (verbose) {
      fprintf(_stderr,"%s: energy_all: %f, energy_last: %f, vad_thold: %f, freq_thold: %f\n",
              (double)(fVar8 / (float)iVar6),(double)(fVar9 / (float)iVar2),(double)vad_thold,
              (double)freq_thold,"vad_simple");
    }
    bVar1 = fVar9 / (float)iVar2 <= (fVar8 / (float)iVar6) * vad_thold;
  }
  return bVar1;
}

Assistant:

bool vad_simple(std::vector<float> & pcmf32, int sample_rate, int last_ms, float vad_thold, float freq_thold, bool verbose) {
    const int n_samples      = pcmf32.size();
    const int n_samples_last = (sample_rate * last_ms) / 1000;

    if (n_samples_last >= n_samples) {
        // not enough samples - assume no speech
        return false;
    }

    if (freq_thold > 0.0f) {
        high_pass_filter(pcmf32, freq_thold, sample_rate);
    }

    float energy_all  = 0.0f;
    float energy_last = 0.0f;

    for (int i = 0; i < n_samples; i++) {
        energy_all += fabsf(pcmf32[i]);

        if (i >= n_samples - n_samples_last) {
            energy_last += fabsf(pcmf32[i]);
        }
    }

    energy_all  /= n_samples;
    energy_last /= n_samples_last;

    if (verbose) {
        fprintf(stderr, "%s: energy_all: %f, energy_last: %f, vad_thold: %f, freq_thold: %f\n", __func__, energy_all, energy_last, vad_thold, freq_thold);
    }

    if (energy_last > vad_thold*energy_all) {
        return false;
    }

    return true;
}